

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsScissorTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gls::Functional::anon_unknown_0::FramebufferClearCase::iterate(FramebufferClearCase *this)

{
  allocator<unsigned_char> *paVar1;
  Vector<int,_4> *this_00;
  RenderContext *renderCtx;
  code *pcVar2;
  Color color;
  Color color_00;
  bool bVar3;
  int iVar4;
  ContextType type;
  GLSLVersion version;
  deUint32 dVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  TestLog *this_01;
  undefined4 extraout_var;
  reference pvVar9;
  MessageBuilder *pMVar10;
  BufferFmtDesc BVar11;
  Vector<unsigned_int,_4> local_82c;
  Vector<unsigned_int,_4> local_81c;
  Vector<unsigned_int,_4> local_80c;
  Vector<int,_4> local_7fc;
  Vector<float,_4> local_7ec;
  Vector<float,_4> local_7dc;
  bool local_7c9;
  bool resultOk;
  float local_7b8;
  MessageBuilder local_7a8;
  float local_618;
  MessageBuilder local_610;
  MessageBuilder local_490;
  undefined4 local_30c;
  undefined1 local_308 [8];
  PixelBufferAccess resAccess;
  PixelBufferAccess refAccess;
  undefined1 local_2b0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> resData;
  undefined1 local_290 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> refData;
  IVec4 scissorArea;
  int height;
  int width;
  Color baseColor;
  undefined1 local_238 [8];
  BufferFmtDesc bufferFmt;
  Renderbuffer depthbuf;
  Renderbuffer colorbuf;
  Framebuffer fbo;
  ProgramSources local_1c8;
  undefined1 local_f8 [8];
  ShaderProgram shader;
  Functions *gl;
  TestLog *log;
  FramebufferClearCase *this_local;
  
  this_01 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  shader.m_program.m_info.linkTimeUs = CONCAT44(extraout_var,iVar4);
  renderCtx = this->m_renderCtx;
  type.super_ApiType.m_bits = (ApiType)(*renderCtx->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  genShaders(&local_1c8,version);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_f8,renderCtx,&local_1c8);
  glu::ProgramSources::~ProgramSources(&local_1c8);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)3> *)&colorbuf.super_ObjectWrapper.m_object,
             (Functions *)shader.m_program.m_info.linkTimeUs);
  glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)2> *)&depthbuf.super_ObjectWrapper.m_object,
             (Functions *)shader.m_program.m_info.linkTimeUs);
  glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)2> *)&bufferFmt.colorFmt,
             (Functions *)shader.m_program.m_info.linkTimeUs);
  BVar11 = getBufferFormat(this->m_clearType);
  bufferFmt.texFmt.order = BVar11.colorFmt;
  baseColor.field_1._8_8_ = BVar11.texFmt;
  local_238 = (undefined1  [8])baseColor.field_1._8_8_;
  getBaseColor((Color *)&height,(BufferFmtDesc *)local_238);
  tcu::Vector<int,_4>::Vector
            ((Vector<int,_4> *)
             ((long)&refData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4),8,8,0x30,0x30);
  iVar4 = tcu::TextureFormat::getPixelSize((TextureFormat *)local_238);
  paVar1 = (allocator<unsigned_char> *)
           ((long)&resData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_char>::allocator(paVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_290,(long)(iVar4 << 0xc)
             ,paVar1);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)
             ((long)&resData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  iVar4 = tcu::TextureFormat::getPixelSize((TextureFormat *)local_238);
  paVar1 = (allocator<unsigned_char> *)((long)&refAccess.super_ConstPixelBufferAccess.m_data + 7);
  std::allocator<unsigned_char>::allocator(paVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2b0,(long)(iVar4 << 0xc)
             ,paVar1);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)((long)&refAccess.super_ConstPixelBufferAccess.m_data + 7))
  ;
  pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_290,0);
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&resAccess.super_ConstPixelBufferAccess.m_data,
             (TextureFormat *)local_238,0x40,0x40,1,pvVar9);
  pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2b0,0);
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_308,(TextureFormat *)local_238,0x40,0x40,1,pvVar9);
  bVar3 = glu::ShaderProgram::isOk((ShaderProgram *)local_f8);
  if (bVar3) {
    pcVar2 = *(code **)(shader.m_program.m_info.linkTimeUs + 0x78);
    dVar5 = glu::ObjectWrapper::operator*((ObjectWrapper *)&colorbuf.super_ObjectWrapper.m_object);
    (*pcVar2)(0x8ca9,dVar5);
    pcVar2 = *(code **)(shader.m_program.m_info.linkTimeUs + 0x78);
    dVar5 = glu::ObjectWrapper::operator*((ObjectWrapper *)&colorbuf.super_ObjectWrapper.m_object);
    (*pcVar2)(0x8ca8,dVar5);
    pcVar2 = *(code **)(shader.m_program.m_info.linkTimeUs + 0xa0);
    dVar5 = glu::ObjectWrapper::operator*((ObjectWrapper *)&depthbuf.super_ObjectWrapper.m_object);
    (*pcVar2)(0x8d41,dVar5);
    (**(code **)(shader.m_program.m_info.linkTimeUs + 0x1238))(0x8d41,bufferFmt.texFmt.order,0x40);
    pcVar2 = *(code **)(shader.m_program.m_info.linkTimeUs + 0x688);
    dVar5 = glu::ObjectWrapper::operator*((ObjectWrapper *)&depthbuf.super_ObjectWrapper.m_object);
    (*pcVar2)(0x8ca9,0x8ce0,0x8d41,dVar5);
    pcVar2 = *(code **)(shader.m_program.m_info.linkTimeUs + 0xa0);
    dVar5 = glu::ObjectWrapper::operator*((ObjectWrapper *)&bufferFmt.colorFmt);
    (*pcVar2)(0x8d41,dVar5);
    (**(code **)(shader.m_program.m_info.linkTimeUs + 0x1238))(0x8d41,0x88f0,0x40);
    pcVar2 = *(code **)(shader.m_program.m_info.linkTimeUs + 0x688);
    dVar5 = glu::ObjectWrapper::operator*((ObjectWrapper *)&bufferFmt.colorFmt);
    (*pcVar2)(0x8ca9,0x821a,0x8d41,dVar5);
    tcu::TestLog::operator<<(&local_490,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar10 = tcu::MessageBuilder::operator<<(&local_490,(char (*) [17])"Scissor area is ");
    pMVar10 = tcu::MessageBuilder::operator<<
                        (pMVar10,(Vector<int,_4> *)
                                 ((long)&refData.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_490);
    tcu::TestLog::operator<<(&local_610,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar10 = tcu::MessageBuilder::operator<<
                        (&local_610,(char (*) [40])"Rendering reference (scissors disabled)");
    tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_610);
    pcVar2 = *(code **)(shader.m_program.m_info.linkTimeUs + 0x1680);
    dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_f8);
    (*pcVar2)(dVar5);
    (**(code **)(shader.m_program.m_info.linkTimeUs + 0x1a00))(0,0,0x40);
    (**(code **)(shader.m_program.m_info.linkTimeUs + 0x4e8))(0xb71);
    (**(code **)(shader.m_program.m_info.linkTimeUs + 0x4e8))(0xb90);
    (**(code **)(shader.m_program.m_info.linkTimeUs + 0x4e8))(0xc11);
    local_618 = baseColor.field_1.f[1];
    color.field_1.f[2] = (float)baseColor.field_1.i[0];
    color.field_1.u[1] = baseColor.type;
    color.field_1.i[0] = width;
    color.type = height;
    color.field_1.f[3] = (float)baseColor.field_1.i[1];
    clearBuffers((Functions *)shader.m_program.m_info.linkTimeUs,color,1.0,0);
    dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_f8);
    (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])(this,(ulong)dVar5);
    glu::readPixels(this->m_renderCtx,0,0,
                    (PixelBufferAccess *)&resAccess.super_ConstPixelBufferAccess.m_data);
    dVar5 = (**(code **)(shader.m_program.m_info.linkTimeUs + 0x800))();
    glu::checkError(dVar5,(char *)0x0,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsScissorTests.cpp"
                    ,0x29e);
    tcu::TestLog::operator<<(&local_7a8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar10 = tcu::MessageBuilder::operator<<
                        (&local_7a8,(char (*) [36])"Rendering result (scissors enabled)");
    tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_7a8);
    pcVar2 = *(code **)(shader.m_program.m_info.linkTimeUs + 0x1680);
    dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_f8);
    (*pcVar2)(dVar5);
    (**(code **)(shader.m_program.m_info.linkTimeUs + 0x1a00))(0,0,0x40);
    (**(code **)(shader.m_program.m_info.linkTimeUs + 0x4e8))(0xb71);
    (**(code **)(shader.m_program.m_info.linkTimeUs + 0x4e8))(0xb90);
    (**(code **)(shader.m_program.m_info.linkTimeUs + 0x4e8))(0xc11);
    local_7b8 = baseColor.field_1.f[1];
    color_00.field_1.f[2] = (float)baseColor.field_1.i[0];
    color_00.field_1.u[1] = baseColor.type;
    color_00.field_1.i[0] = width;
    color_00.type = height;
    color_00.field_1.f[3] = (float)baseColor.field_1.i[1];
    clearBuffers((Functions *)shader.m_program.m_info.linkTimeUs,color_00,1.0,0);
    (**(code **)(shader.m_program.m_info.linkTimeUs + 0x5e0))(0xc11);
    pcVar2 = *(code **)(shader.m_program.m_info.linkTimeUs + 0x1290);
    this_00 = (Vector<int,_4> *)
              ((long)&refData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 4);
    iVar4 = tcu::Vector<int,_4>::x(this_00);
    iVar6 = tcu::Vector<int,_4>::y(this_00);
    iVar7 = tcu::Vector<int,_4>::z(this_00);
    iVar8 = tcu::Vector<int,_4>::w(this_00);
    (*pcVar2)(iVar4,iVar6,iVar7,iVar8);
    dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_f8);
    (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])(this,(ulong)dVar5);
    glu::readPixels(this->m_renderCtx,0,0,(PixelBufferAccess *)local_308);
    dVar5 = (**(code **)(shader.m_program.m_info.linkTimeUs + 0x800))();
    glu::checkError(dVar5,(char *)0x0,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsScissorTests.cpp"
                    ,0x2b4);
    local_7c9 = false;
    if (height == 0) {
      tcu::Vector<float,_4>::Vector
                (&local_7dc,(float)width,(float)baseColor.type,baseColor.field_1.f[0],
                 baseColor.field_1.f[1]);
      Functional::(anonymous_namespace)::clearEdges<tcu::Vector<float,4>>
                ((PixelBufferAccess *)&resAccess.super_ConstPixelBufferAccess.m_data,&local_7dc,
                 (IVec4 *)((long)&refData.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      tcu::Vector<float,_4>::Vector(&local_7ec,0.02,0.02,0.02,0.02);
      local_7c9 = tcu::floatThresholdCompare
                            (this_01,"ComparisonResult","Image comparison result",
                             (ConstPixelBufferAccess *)
                             &resAccess.super_ConstPixelBufferAccess.m_data,
                             (ConstPixelBufferAccess *)local_308,&local_7ec,COMPARE_LOG_RESULT);
    }
    else if (height == 1) {
      tcu::Vector<int,_4>::Vector
                (&local_7fc,width,baseColor.type,baseColor.field_1.i[0],baseColor.field_1.i[1]);
      Functional::(anonymous_namespace)::clearEdges<tcu::Vector<int,4>>
                ((PixelBufferAccess *)&resAccess.super_ConstPixelBufferAccess.m_data,&local_7fc,
                 (IVec4 *)((long)&refData.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      tcu::Vector<unsigned_int,_4>::Vector(&local_80c,2,2,2,2);
      local_7c9 = tcu::intThresholdCompare
                            (this_01,"ComparisonResult","Image comparison result",
                             (ConstPixelBufferAccess *)
                             &resAccess.super_ConstPixelBufferAccess.m_data,
                             (ConstPixelBufferAccess *)local_308,&local_80c,COMPARE_LOG_RESULT);
    }
    else if (height == 2) {
      tcu::Vector<unsigned_int,_4>::Vector
                (&local_81c,width,baseColor.type,baseColor.field_1.u[0],baseColor.field_1.u[1]);
      Functional::(anonymous_namespace)::clearEdges<tcu::Vector<unsigned_int,4>>
                ((PixelBufferAccess *)&resAccess.super_ConstPixelBufferAccess.m_data,&local_81c,
                 (IVec4 *)((long)&refData.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      tcu::Vector<unsigned_int,_4>::Vector(&local_82c,2,2,2,2);
      local_7c9 = tcu::intThresholdCompare
                            (this_01,"ComparisonResult","Image comparison result",
                             (ConstPixelBufferAccess *)
                             &resAccess.super_ConstPixelBufferAccess.m_data,
                             (ConstPixelBufferAccess *)local_308,&local_82c,COMPARE_LOG_RESULT);
    }
    if (local_7c9 == false) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Image comparison failed");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
    }
  }
  else {
    glu::operator<<(this_01,(ShaderProgram *)local_f8);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Shader compile/link failed");
  }
  local_30c = 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2b0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_290);
  glu::TypedObjectWrapper<(glu::ObjectType)2>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)2> *)&bufferFmt.colorFmt);
  glu::TypedObjectWrapper<(glu::ObjectType)2>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)2> *)&depthbuf.super_ObjectWrapper.m_object);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)3> *)&colorbuf.super_ObjectWrapper.m_object);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_f8);
  return STOP;
}

Assistant:

FramebufferClearCase::IterateResult FramebufferClearCase::iterate (void)
{
	TestLog&					log				= m_testCtx.getLog();
	const glw::Functions&		gl				= m_renderCtx.getFunctions();
	const glu::ShaderProgram	shader			(m_renderCtx, genShaders(glu::getContextTypeGLSLVersion(m_renderCtx.getType())));

	const glu::Framebuffer		fbo				(gl);
	const glu::Renderbuffer		colorbuf		(gl);
	const glu::Renderbuffer		depthbuf		(gl);

	const BufferFmtDesc			bufferFmt		= getBufferFormat(m_clearType);
	const Color					baseColor		= getBaseColor(bufferFmt);

	const int					width			= 64;
	const int					height			= 64;

	const IVec4					scissorArea		(8, 8, 48, 48);

	vector<deUint8>				refData			(width*height*bufferFmt.texFmt.getPixelSize());
	vector<deUint8>				resData			(width*height*bufferFmt.texFmt.getPixelSize());

	tcu::PixelBufferAccess		refAccess		(bufferFmt.texFmt, width, height, 1, &refData[0]);
	tcu::PixelBufferAccess		resAccess		(bufferFmt.texFmt, width, height, 1, &resData[0]);

	if (!shader.isOk())
	{
		log << shader;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Shader compile/link failed");
		return STOP;
	}

	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, *fbo);
	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, *fbo);

	// Color
	gl.bindRenderbuffer(GL_RENDERBUFFER, *colorbuf);
	gl.renderbufferStorage(GL_RENDERBUFFER, bufferFmt.colorFmt, width, height);
	gl.framebufferRenderbuffer(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, *colorbuf);

	// Depth/stencil
	gl.bindRenderbuffer(GL_RENDERBUFFER, *depthbuf);
	gl.renderbufferStorage(GL_RENDERBUFFER, GL_DEPTH24_STENCIL8, width, height);
	gl.framebufferRenderbuffer(GL_DRAW_FRAMEBUFFER, GL_DEPTH_STENCIL_ATTACHMENT, GL_RENDERBUFFER, *depthbuf);

	log << TestLog::Message << "Scissor area is " << scissorArea << TestLog::EndMessage;

	// Render reference
	{
		log << TestLog::Message << "Rendering reference (scissors disabled)" << TestLog::EndMessage;

		gl.useProgram(shader.getProgram());
		gl.viewport(0, 0, width, height);

		gl.disable(GL_DEPTH_TEST);
		gl.disable(GL_STENCIL_TEST);
		gl.disable(GL_SCISSOR_TEST);

		clearBuffers(gl, baseColor, 1.0f, 0);

		render(shader.getProgram());

		glu::readPixels(m_renderCtx, 0, 0, refAccess);
		GLU_CHECK_ERROR(gl.getError());
	}

	// Render result
	{
		log << TestLog::Message << "Rendering result (scissors enabled)" << TestLog::EndMessage;

		gl.useProgram(shader.getProgram());
		gl.viewport(0, 0, width, height);

		gl.disable(GL_DEPTH_TEST);
		gl.disable(GL_STENCIL_TEST);
		gl.disable(GL_SCISSOR_TEST);

		clearBuffers(gl, baseColor, 1.0f, 0);

		gl.enable(GL_SCISSOR_TEST);
		gl.scissor(scissorArea.x(), scissorArea.y(), scissorArea.z(), scissorArea.w());

		render(shader.getProgram());

		glu::readPixels(m_renderCtx, 0, 0, resAccess);
		GLU_CHECK_ERROR(gl.getError());
	}

	{
		bool resultOk = false;

		switch (baseColor.type)
		{
			case Color::FLOAT:
				clearEdges(refAccess, Vec4(baseColor.f[0], baseColor.f[1], baseColor.f[2], baseColor.f[3]), scissorArea);
				resultOk = tcu::floatThresholdCompare(log, "ComparisonResult", "Image comparison result", refAccess, resAccess, Vec4(0.02f, 0.02f, 0.02f, 0.02f), tcu::COMPARE_LOG_RESULT);
				break;

			case Color::INT:
				clearEdges(refAccess, IVec4(baseColor.i[0], baseColor.i[1], baseColor.i[2], baseColor.i[3]), scissorArea);
				resultOk = tcu::intThresholdCompare(log, "ComparisonResult", "Image comparison result", refAccess, resAccess, UVec4(2, 2, 2, 2), tcu::COMPARE_LOG_RESULT);
				break;

			case Color::UINT:
				clearEdges(refAccess, UVec4(baseColor.u[0], baseColor.u[1], baseColor.u[2], baseColor.u[3]), scissorArea);
				resultOk = tcu::intThresholdCompare(log, "ComparisonResult", "Image comparison result", refAccess, resAccess, UVec4(2, 2, 2, 2), tcu::COMPARE_LOG_RESULT);
				break;
		}

		if (resultOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
	}

	return STOP;
}